

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::adaptive_huffman_data_model::update(adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uint8 *pCodesizes;
  uint uVar2;
  void *pContext;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint total_freq;
  uint max_code_size;
  uint local_20;
  uint local_1c;
  
  uVar2 = this->m_total_count + this->m_update_cycle;
  this->m_total_count = uVar2;
  if (0x7fff < uVar2) {
    uVar2 = this->m_total_syms;
    if ((ulong)uVar2 == 0) {
      uVar3 = 0;
    }
    else {
      puVar1 = (this->m_sym_freq).m_p;
      uVar4 = 0;
      uVar3 = 0;
      do {
        uVar5 = puVar1[uVar4] + 1 >> 1;
        uVar3 = uVar3 + uVar5;
        puVar1[uVar4] = (unsigned_short)uVar5;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    this->m_total_count = uVar3;
  }
  pContext = create_generate_huffman_codes_tables();
  generate_huffman_codes
            (pContext,this->m_total_syms,(this->m_sym_freq).m_p,(this->m_code_sizes).m_p,&local_1c,
             &local_20);
  if (0x10 < local_1c) {
    prefix_coding::limit_max_code_size(this->m_total_syms,(this->m_code_sizes).m_p,0x10);
  }
  free_generate_huffman_codes_tables(pContext);
  pCodesizes = (this->m_code_sizes).m_p;
  if (this->m_encoding == true) {
    prefix_coding::generate_codes(this->m_total_syms,pCodesizes,(this->m_codes).m_p);
  }
  else {
    prefix_coding::generate_decoder_tables
              (this->m_total_syms,pCodesizes,this->m_pDecode_tables,(uint)this->m_decoder_table_bits
              );
  }
  uVar5 = this->m_update_cycle * 5 >> 2;
  uVar2 = this->m_total_syms * 8 + 0x30;
  if (uVar2 <= uVar5) {
    uVar5 = uVar2;
  }
  this->m_update_cycle = uVar5;
  this->m_symbols_until_update = uVar5;
  return;
}

Assistant:

void adaptive_huffman_data_model::update()
    {
        m_total_count += m_update_cycle;

        if (m_total_count >= 32768)
        {
            rescale();
        }

        void* pTables = create_generate_huffman_codes_tables();

        uint max_code_size, total_freq;
        bool status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
        CRNLIB_ASSERT(status);
        CRNLIB_ASSERT(total_freq == m_total_count);

        if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
        {
            prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
        }

        free_generate_huffman_codes_tables(pTables);

        if (m_encoding)
        {
            status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
        }
        else
        {
            status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);
        }

        CRNLIB_ASSERT(status);
        (void)status;

        m_update_cycle = (5 * m_update_cycle) >> 2;
        uint max_cycle = (m_total_syms + 6) << 3; // this was << 2 - which is ~12% slower but compresses around .5% better

        if (m_update_cycle > max_cycle)
        {
            m_update_cycle = max_cycle;
        }

        m_symbols_until_update = m_update_cycle;
    }